

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O1

bool __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::MatchRange(GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *this,SizeType rangeIndex,uint codepoint)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->regex_->rangeCount_;
  if (rangeIndex < uVar1) {
    pcVar2 = (this->regex_->ranges_).stack_;
    uVar3 = (ulong)rangeIndex;
    while( true ) {
      if (rangeIndex == 0xffffffff) {
        return SUB41((uint)*(int *)(pcVar2 + uVar3 * 0xc) >> 0x1f,0);
      }
      if (uVar1 <= rangeIndex) break;
      uVar4 = (ulong)rangeIndex;
      rangeIndex = *(SizeType *)(pcVar2 + uVar4 * 0xc + 8);
      if (codepoint <= *(uint *)(pcVar2 + uVar4 * 0xc + 4) &&
          (*(uint *)(pcVar2 + uVar4 * 0xc) & 0x7fffffff) <= codepoint) {
        return -1 < *(int *)(pcVar2 + uVar3 * 0xc);
      }
    }
  }
  __assert_fail("index < rangeCount_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                ,0xb9,
                "const Range &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetRange(SizeType) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool MatchRange(SizeType rangeIndex, unsigned codepoint) const {
        bool yes = (regex_.GetRange(rangeIndex).start & RegexType::kRangeNegationFlag) == 0;
        while (rangeIndex != kRegexInvalidRange) {
            const Range& r = regex_.GetRange(rangeIndex);
            if (codepoint >= (r.start & ~RegexType::kRangeNegationFlag) && codepoint <= r.end)
                return yes;
            rangeIndex = r.next;
        }
        return !yes;
    }